

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Select * sqlite3SelectNew(Parse *pParse,ExprList *pEList,SrcList *pSrc,Expr *pWhere,
                         ExprList *pGroupBy,Expr *pHaving,ExprList *pOrderBy,u32 selFlags,
                         Expr *pLimit)

{
  Expr *pExpr;
  u32 uVar1;
  undefined1 local_c8 [8];
  Select standin;
  Select *pAllocated;
  Select *pNew;
  Expr *pHaving_local;
  ExprList *pGroupBy_local;
  Expr *pWhere_local;
  SrcList *pSrc_local;
  ExprList *pEList_local;
  Parse *pParse_local;
  
  standin.pWinDefn = (Window *)sqlite3DbMallocRawNN(pParse->db,0x80);
  pAllocated = (Select *)standin.pWinDefn;
  if (standin.pWinDefn == (Window *)0x0) {
    pAllocated = (Select *)local_c8;
  }
  pSrc_local = (SrcList *)pEList;
  if (pEList == (ExprList *)0x0) {
    pExpr = sqlite3Expr(pParse->db,0xb4,(char *)0x0);
    pSrc_local = (SrcList *)sqlite3ExprListAppend(pParse,(ExprList *)0x0,pExpr);
  }
  pAllocated->pEList = (ExprList *)pSrc_local;
  pAllocated->op = 0x8a;
  pAllocated->selFlags = selFlags;
  pAllocated->iLimit = 0;
  pAllocated->iOffset = 0;
  uVar1 = pParse->nSelect + 1;
  pParse->nSelect = uVar1;
  pAllocated->selId = uVar1;
  pAllocated->addrOpenEphm[0] = -1;
  pAllocated->addrOpenEphm[1] = -1;
  pAllocated->nSelectRow = 0;
  pWhere_local = (Expr *)pSrc;
  if (pSrc == (SrcList *)0x0) {
    pWhere_local = (Expr *)sqlite3DbMallocZero(pParse->db,0x70);
  }
  pAllocated->pSrc = (SrcList *)pWhere_local;
  pAllocated->pWhere = pWhere;
  pAllocated->pGroupBy = pGroupBy;
  pAllocated->pHaving = pHaving;
  pAllocated->pOrderBy = pOrderBy;
  pAllocated->pPrior = (Select *)0x0;
  pAllocated->pNext = (Select *)0x0;
  pAllocated->pLimit = pLimit;
  pAllocated->pWith = (With *)0x0;
  pAllocated->pWin = (Window *)0x0;
  pAllocated->pWinDefn = (Window *)0x0;
  if (pParse->db->mallocFailed != '\0') {
    clearSelect(pParse->db,pAllocated,(uint)(pAllocated != (Select *)local_c8));
    standin.pWinDefn = (Window *)0x0;
  }
  return (Select *)standin.pWinDefn;
}

Assistant:

SQLITE_PRIVATE Select *sqlite3SelectNew(
  Parse *pParse,        /* Parsing context */
  ExprList *pEList,     /* which columns to include in the result */
  SrcList *pSrc,        /* the FROM clause -- which tables to scan */
  Expr *pWhere,         /* the WHERE clause */
  ExprList *pGroupBy,   /* the GROUP BY clause */
  Expr *pHaving,        /* the HAVING clause */
  ExprList *pOrderBy,   /* the ORDER BY clause */
  u32 selFlags,         /* Flag parameters, such as SF_Distinct */
  Expr *pLimit          /* LIMIT value.  NULL means not used */
){
  Select *pNew, *pAllocated;
  Select standin;
  pAllocated = pNew = sqlite3DbMallocRawNN(pParse->db, sizeof(*pNew) );
  if( pNew==0 ){
    assert( pParse->db->mallocFailed );
    pNew = &standin;
  }
  if( pEList==0 ){
    pEList = sqlite3ExprListAppend(pParse, 0,
                                   sqlite3Expr(pParse->db,TK_ASTERISK,0));
  }
  pNew->pEList = pEList;
  pNew->op = TK_SELECT;
  pNew->selFlags = selFlags;
  pNew->iLimit = 0;
  pNew->iOffset = 0;
  pNew->selId = ++pParse->nSelect;
  pNew->addrOpenEphm[0] = -1;
  pNew->addrOpenEphm[1] = -1;
  pNew->nSelectRow = 0;
  if( pSrc==0 ) pSrc = sqlite3DbMallocZero(pParse->db, sizeof(*pSrc));
  pNew->pSrc = pSrc;
  pNew->pWhere = pWhere;
  pNew->pGroupBy = pGroupBy;
  pNew->pHaving = pHaving;
  pNew->pOrderBy = pOrderBy;
  pNew->pPrior = 0;
  pNew->pNext = 0;
  pNew->pLimit = pLimit;
  pNew->pWith = 0;
#ifndef SQLITE_OMIT_WINDOWFUNC
  pNew->pWin = 0;
  pNew->pWinDefn = 0;
#endif
  if( pParse->db->mallocFailed ) {
    clearSelect(pParse->db, pNew, pNew!=&standin);
    pAllocated = 0;
  }else{
    assert( pNew->pSrc!=0 || pParse->nErr>0 );
  }
  return pAllocated;
}